

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O3

void __thiscall
QGlobalNetworkProxy::setApplicationProxy(QGlobalNetworkProxy *this,QNetworkProxy *proxy)

{
  QNetworkProxy *this_00;
  QDeadlineTimer QVar1;
  
  QVar1.t2 = 0xffffffff;
  QVar1.type = 0x7fffffff;
  QVar1.t1 = (qint64)this;
  QRecursiveMutex::tryLock(QVar1);
  this_00 = this->applicationLevelProxy;
  if (this_00 == (QNetworkProxy *)0x0) {
    this_00 = (QNetworkProxy *)operator_new(8);
    QNetworkProxy::QNetworkProxy(this_00);
    this->applicationLevelProxy = this_00;
  }
  QSharedDataPointer<QNetworkProxyPrivate>::reset(&this_00->d,(proxy->d).d.ptr);
  if (this->applicationLevelProxyFactory != (QNetworkProxyFactory *)0x0) {
    (*this->applicationLevelProxyFactory->_vptr_QNetworkProxyFactory[1])();
  }
  this->applicationLevelProxyFactory = (QNetworkProxyFactory *)0x0;
  this->useSystemProxies = false;
  QRecursiveMutex::unlock();
  return;
}

Assistant:

void setApplicationProxy(const QNetworkProxy &proxy)
    {
        QMutexLocker lock(&mutex);
        if (!applicationLevelProxy)
            applicationLevelProxy = new QNetworkProxy;
        *applicationLevelProxy = proxy;
        delete applicationLevelProxyFactory;
        applicationLevelProxyFactory = nullptr;
        useSystemProxies = false;
    }